

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O1

int AF_A_PhoenixPuff(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  PClassActor *pPVar7;
  AActor *pAVar8;
  char *__assertion;
  bool bVar9;
  double dVar10;
  double dVar11;
  FName local_4c;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005a4f30;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar5 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = uVar5;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar9 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar4 && bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar4) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar9) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005a4f30;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005a4f05;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005a4f30;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_4c.Index = FName::NameManager::FindName(&FName::NameData,"PhoenixPuff",false);
      local_48.X = (double)puVar2[9];
      local_48.Y = (double)puVar2[10];
      local_48.Z = (double)puVar2[0xb];
      pPVar7 = ClassForSpawn(&local_4c);
      pAVar8 = AActor::StaticSpawn(pPVar7,&local_48,ALLOW_REPLACE,false);
      dVar10 = FFastTrig::cos(&fasttrig,
                              ((double)puVar2[0x12] + 90.0) * 11930464.711111112 +
                              6755399441055744.0);
      dVar11 = FFastTrig::sin(&fasttrig,dVar10 * 1.3);
      (pAVar8->Vel).Z = 0.0;
      (pAVar8->Vel).Y = dVar11 * 1.3;
      (pAVar8->Vel).X = dVar10 * 1.3;
      local_4c.Index = FName::NameManager::FindName(&FName::NameData,"PhoenixPuff",false);
      local_48.X = (double)puVar2[9];
      local_48.Y = (double)puVar2[10];
      local_48.Z = (double)puVar2[0xb];
      pPVar7 = ClassForSpawn(&local_4c);
      pAVar8 = AActor::StaticSpawn(pPVar7,&local_48,ALLOW_REPLACE,false);
      dVar10 = FFastTrig::cos(&fasttrig,
                              ((double)puVar2[0x12] + -90.0) * 11930464.711111112 +
                              6755399441055744.0);
      dVar11 = FFastTrig::sin(&fasttrig,dVar10 * 1.3);
      (pAVar8->Vel).Z = 0.0;
      (pAVar8->Vel).Y = dVar11 * 1.3;
      (pAVar8->Vel).X = dVar10 * 1.3;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005a4f05:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005a4f30:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x4de,"int AF_A_PhoenixPuff(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PhoenixPuff)
{
	PARAM_ACTION_PROLOGUE;

	AActor *puff;
	DAngle angle;

	//[RH] Heretic never sets the target for seeking
	//P_SeekerMissile (self, 5, 10);
	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw + 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);

	puff = Spawn("PhoenixPuff", self->Pos(), ALLOW_REPLACE);
	angle = self->Angles.Yaw - 90;
	puff->Vel = DVector3(angle.ToVector(1.3), 0);
	return 0;
}